

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableServiceGenerator::GenerateAbstractMethods
          (ImmutableServiceGenerator *this,Printer *printer)

{
  int iVar1;
  long in_RDI;
  MethodDescriptor *method;
  Printer *in_stack_00000020;
  int i;
  MethodDescriptor *in_stack_00000048;
  Printer *in_stack_00000050;
  IsAbstract in_stack_0000018c;
  MethodDescriptor *in_stack_00000190;
  Printer *in_stack_00000198;
  ImmutableServiceGenerator *in_stack_000001a0;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(*(ServiceDescriptor **)(in_RDI + 8));
    if (iVar1 <= local_14) break;
    ServiceDescriptor::method(*(ServiceDescriptor **)(in_RDI + 8),local_14);
    WriteMethodDocComment(in_stack_00000050,in_stack_00000048);
    GenerateMethodSignature(in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_0000018c)
    ;
    io::Printer::Print<>(in_stack_00000020,(char *)method);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void ImmutableServiceGenerator::GenerateAbstractMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    WriteMethodDocComment(printer, method);
    GenerateMethodSignature(printer, method, IS_ABSTRACT);
    printer->Print(";\n\n");
  }
}